

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshCache.cpp
# Opt level: O1

SNamedPath * __thiscall irr::scene::CMeshCache::getMeshName(CMeshCache *this,IMesh *mesh)

{
  IMesh *pIVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  uint uVar4;
  long lVar5;
  
  if ((mesh != (IMesh *)0x0) &&
     (lVar3 = *(long *)&(this->super_IMeshCache).field_0x8,
     (int)((ulong)(*(long *)&(this->super_IMeshCache).field_0x10 - lVar3) >> 3) * 0x38e38e39 != 0))
  {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pIVar1 = *(IMesh **)(lVar3 + 0x40 + lVar5);
      if ((pIVar1 == mesh) ||
         ((pIVar1 != (IMesh *)0x0 &&
          (iVar2 = (*pIVar1->_vptr_IMesh[0xd])(pIVar1,0,0xff,0xffffffff,0xffffffff),
          (IMesh *)CONCAT44(extraout_var,iVar2) == mesh)))) {
        return (SNamedPath *)(lVar5 + *(long *)&(this->super_IMeshCache).field_0x8);
      }
      uVar4 = uVar4 + 1;
      lVar3 = *(long *)&(this->super_IMeshCache).field_0x8;
      lVar5 = lVar5 + 0x48;
    } while (uVar4 < (uint)((int)((ulong)(*(long *)&(this->super_IMeshCache).field_0x10 - lVar3) >>
                                 3) * 0x38e38e39));
  }
  return (SNamedPath *)emptyNamedPath;
}

Assistant:

const io::SNamedPath &CMeshCache::getMeshName(const IMesh *const mesh) const
{
	if (!mesh)
		return emptyNamedPath;

	for (u32 i = 0; i < Meshes.size(); ++i) {
		if (Meshes[i].Mesh == mesh || (Meshes[i].Mesh && Meshes[i].Mesh->getMesh(0) == mesh))
			return Meshes[i].NamedPath;
	}

	return emptyNamedPath;
}